

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

void xmlBufferFree(xmlBufferPtr buf)

{
  xmlChar *pxVar1;
  
  if (buf == (xmlBufferPtr)0x0) {
    return;
  }
  if (buf->alloc == XML_BUFFER_ALLOC_IO) {
    pxVar1 = buf->contentIO;
    if ((pxVar1 == (xmlChar *)0x0) && (pxVar1 = buf->content, pxVar1 == (xmlChar *)0x0))
    goto LAB_00187e6e;
  }
  else {
    pxVar1 = buf->content;
    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE || pxVar1 == (xmlChar *)0x0) goto LAB_00187e6e;
  }
  (*xmlFree)(pxVar1);
LAB_00187e6e:
  (*xmlFree)(buf);
  return;
}

Assistant:

void
xmlBufferFree(xmlBufferPtr buf) {
    if (buf == NULL) {
#ifdef DEBUG_BUFFER
        xmlGenericError(xmlGenericErrorContext,
		"xmlBufferFree: buf == NULL\n");
#endif
	return;
    }

    if ((buf->alloc == XML_BUFFER_ALLOC_IO) &&
        (buf->contentIO != NULL)) {
        xmlFree(buf->contentIO);
    } else if ((buf->content != NULL) &&
        (buf->alloc != XML_BUFFER_ALLOC_IMMUTABLE)) {
        xmlFree(buf->content);
    }
    xmlFree(buf);
}